

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O0

void __thiscall
diy::RegularLink<diy::Bounds<int>_>::save(RegularLink<diy::Bounds<int>_> *this,BinaryBuffer *bb)

{
  Link *in_RSI;
  Bounds<int> *in_RDI;
  
  Link::save(in_RSI,(BinaryBuffer *)in_RDI);
  save<int>((BinaryBuffer *)in_RSI,(int *)in_RDI);
  save<std::map<diy::Direction,int,std::less<diy::Direction>,std::allocator<std::pair<diy::Direction_const,int>>>>
            ((BinaryBuffer *)in_RSI,
             (map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
              *)in_RDI);
  save<std::vector<diy::Direction,std::allocator<diy::Direction>>>
            ((BinaryBuffer *)in_RSI,
             (vector<diy::Direction,_std::allocator<diy::Direction>_> *)in_RDI);
  save<diy::Bounds<int>>((BinaryBuffer *)in_RSI,in_RDI);
  save<diy::Bounds<int>>((BinaryBuffer *)in_RSI,in_RDI);
  save<std::vector<diy::Bounds<int>,std::allocator<diy::Bounds<int>>>>
            ((BinaryBuffer *)in_RSI,
             (vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_> *)in_RDI);
  save<std::vector<diy::Bounds<int>,std::allocator<diy::Bounds<int>>>>
            ((BinaryBuffer *)in_RSI,
             (vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_> *)in_RDI);
  save<std::vector<diy::Direction,std::allocator<diy::Direction>>>
            ((BinaryBuffer *)in_RSI,
             (vector<diy::Direction,_std::allocator<diy::Direction>_> *)in_RDI);
  return;
}

Assistant:

void      save(BinaryBuffer& bb) const override
      {
          Link::save(bb);
          diy::save(bb, dim_);
          diy::save(bb, dir_map_);
          diy::save(bb, dir_vec_);
          diy::save(bb, core_);
          diy::save(bb, bounds_);
          diy::save(bb, nbr_cores_);
          diy::save(bb, nbr_bounds_);
          diy::save(bb, wrap_);
      }